

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarchingCube.cpp
# Opt level: O2

bool __thiscall MarchingCube::check(MarchingCube *this,vec3 *left,vec3 *right)

{
  bool bVar1;
  
  bVar1 = true;
  if ((right->field_0).x <= (left->field_0).x) {
    if ((left->field_0).x <= (right->field_0).x) {
      if ((left->field_1).y < (right->field_1).y) {
        return true;
      }
      if (((left->field_1).y <= (right->field_1).y) &&
         ((left->field_2).z <= (right->field_2).z && (right->field_2).z != (left->field_2).z)) {
        return true;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool MarchingCube::check(
        const glm::vec3& left,
        const glm::vec3& right
    ) const
{
    if (left.x < right.x)
        return true;
    else if (left.x > right.x)
        return false;
    if (left.y < right.y)
        return true;
    else if (left.y > right.y)
        return false;
    if (left.z < right.z)
        return true;
    else if (left.z > right.z)
        return false;
    return false;
}